

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_fast.cpp
# Opt level: O2

void crnlib::dxt_fast::compress_solid_block
               (uint n,uint *ave_color,uint *low16,uint *high16,uint8 *pSelectors)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *ave_color;
  uVar2 = ave_color[1];
  uVar3 = ave_color[2];
  memset(pSelectors,2,(ulong)n);
  *low16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)uVar3 * 2] |
           (uint)(byte)ryg_dxt::OMatch6[(ulong)uVar2 * 2] << 5 |
           (uint)(byte)ryg_dxt::OMatch5[(ulong)uVar1 * 2] << 0xb;
  *high16 = (uint)(byte)ryg_dxt::OMatch5[(ulong)uVar3 * 2 + 1] |
            (uint)(byte)ryg_dxt::OMatch6[(ulong)uVar2 * 2 + 1] << 5 |
            (uint)(byte)ryg_dxt::OMatch5[(ulong)uVar1 * 2 + 1] << 0xb;
  return;
}

Assistant:

static void compress_solid_block(uint n, uint ave_color[3], uint& low16, uint& high16, uint8* pSelectors)
        {
            uint r = ave_color[0];
            uint g = ave_color[1];
            uint b = ave_color[2];

            memset(pSelectors, 2, n);

            low16 = (ryg_dxt::OMatch5[r][0] << 11) | (ryg_dxt::OMatch6[g][0] << 5) | ryg_dxt::OMatch5[b][0];
            high16 = (ryg_dxt::OMatch5[r][1] << 11) | (ryg_dxt::OMatch6[g][1] << 5) | ryg_dxt::OMatch5[b][1];
        }